

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O0

void TestEq<MyGame::Example::Ability_const*,MyGame::Example::Ability_const*>
               (Ability *expval,Ability *val,char *exp,char *file,int line,char *func)

{
  type pAVar1;
  char *expval_00;
  char *val_00;
  Ability *t;
  Ability *t_00;
  string local_78;
  string local_58;
  char *local_38;
  char *func_local;
  char *pcStack_28;
  int line_local;
  char *file_local;
  char *exp_local;
  Ability *val_local;
  Ability *expval_local;
  
  if (expval != val) {
    local_38 = func;
    func_local._4_4_ = line;
    pcStack_28 = file;
    file_local = exp;
    exp_local = (char *)val;
    val_local = expval;
    pAVar1 = scalar_as_underlying<MyGame::Example::Ability_const*>(expval);
    flatbuffers::NumToString<MyGame::Example::Ability_const*>(&local_58,(flatbuffers *)pAVar1,t);
    expval_00 = (char *)std::__cxx11::string::c_str();
    pAVar1 = scalar_as_underlying<MyGame::Example::Ability_const*>((Ability *)exp_local);
    flatbuffers::NumToString<MyGame::Example::Ability_const*>(&local_78,(flatbuffers *)pAVar1,t_00);
    val_00 = (char *)std::__cxx11::string::c_str();
    TestFail(expval_00,val_00,file_local,pcStack_28,func_local._4_4_,local_38);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *exp, const char *file, int line,
            const char *func) {
  if (static_cast<U>(expval) != val) {
    TestFail(flatbuffers::NumToString(scalar_as_underlying(expval)).c_str(),
             flatbuffers::NumToString(scalar_as_underlying(val)).c_str(), exp,
             file, line, func);
  }
}